

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O1

bool bcache_invalidate_block(filemgr *file,bid_t bid)

{
  avl_node **ppaVar1;
  __pointer_type pfVar2;
  byte bVar3;
  hash_elem *e;
  byte bVar4;
  ulong uVar5;
  timeval tp;
  bcache_item query;
  timeval local_70;
  bid_t local_60;
  hash_elem local_50 [2];
  
  pfVar2 = (file->bcache)._M_b._M_p;
  if (pfVar2 == (__pointer_type)0x0) {
    return false;
  }
  local_60 = bid;
  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
  (pfVar2->access_timestamp).super___atomic_base<unsigned_long>._M_i =
       local_70.tv_sec * 1000000 + local_70.tv_usec;
  uVar5 = bid % pfVar2->num_shards;
  pthread_spin_lock(&pfVar2->shards[uVar5].lock);
  e = hash_find(&pfVar2->shards[uVar5].hashtable,local_50);
  if (e != (hash_elem *)0x0) {
    if (((ulong)e[1].avl.right & 4) != 0) {
      pthread_spin_unlock(&pfVar2->shards[uVar5].lock);
      bVar3 = 0;
      bVar4 = 0;
      goto LAB_0010432a;
    }
    if (((ulong)e[1].avl.right & 1) == 0) {
      LOCK();
      (pfVar2->nitems).super___atomic_base<unsigned_long>._M_i =
           (pfVar2->nitems).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      hash_remove(&pfVar2->shards[uVar5].hashtable,e);
      list_remove(&pfVar2->shards[uVar5].cleanlist,(list_elem *)(e + 1));
      pthread_spin_unlock(&pfVar2->shards[uVar5].lock);
      _bcache_release_freeblock((bcache_item *)&e[-1].avl.left);
      bVar3 = 1;
      bVar4 = 1;
      goto LAB_0010432a;
    }
    LOCK();
    ppaVar1 = &e[1].avl.right;
    *(byte *)ppaVar1 = *(byte *)ppaVar1 | 2;
    UNLOCK();
    LOCK();
    (pfVar2->nimmutable).super___atomic_base<unsigned_long>._M_i =
         (pfVar2->nimmutable).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  pthread_spin_unlock(&pfVar2->shards[uVar5].lock);
  bVar4 = 1;
  bVar3 = 0;
LAB_0010432a:
  return (bool)(bVar3 & bVar4);
}

Assistant:

bool bcache_invalidate_block(struct filemgr *file, bid_t bid)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname;
    bool ret = false;

    // Note that we don't need to grab bcache_lock here as the block cache
    // is already created and binded when the file is created or opened for
    // the first time.
    fname = file->bcache;

    if (fname) {
        // file exists
        // set query
        query.bid = bid;
        // Update the access timestamp.
        struct timeval tp;
        gettimeofday(&tp, NULL);
        atomic_store_uint64_t(&fname->access_timestamp,
                              (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                              std::memory_order_relaxed);

        size_t shard_num = bid % fname->num_shards;
        spin_lock(&fname->shards[shard_num].lock);

        // search BHASH
        h = hash_find(&fname->shards[shard_num].hashtable, &query.hash_elem);
        if (h) {
            // cache hit
            item = _get_entry(h, struct bcache_item, hash_elem);
            if (item->flag & BCACHE_FREE) {
                spin_unlock(&fname->shards[shard_num].lock);
                DBG("Warning: failed to invalidate the buffer cache entry for a file '%s' "
                    "because the entry belongs to the free list!\n",
                    file->filename);
                return false;
            }

            if (!(item->flag & BCACHE_DIRTY)) {
                atomic_decr_uint64_t(&fname->nitems);
                // only for clean blocks
                // remove from hash and insert into freelist
                hash_remove(&fname->shards[shard_num].hashtable, &item->hash_elem);
                // remove from clean list
                list_remove(&fname->shards[shard_num].cleanlist, &item->list_elem);
                spin_unlock(&fname->shards[shard_num].lock);

                // add to freelist
                _bcache_release_freeblock(item);
                ret = true;
            } else {
                item->flag |= BCACHE_IMMUTABLE; // (stale index node block)
                atomic_incr_uint64_t(&fname->nimmutable);
                spin_unlock(&fname->shards[shard_num].lock);
            }
        } else {
            // cache miss
            spin_unlock(&fname->shards[shard_num].lock);
        }
    }
    return ret;
}